

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSParserImpl::startEntityReference(DOMLSParserImpl *this,XMLEntityDecl *entDecl)

{
  bool bVar1;
  FilterAction *pFVar2;
  FilterAction local_24;
  DOMNode *local_20;
  DOMNode *origParent;
  XMLEntityDecl *entDecl_local;
  DOMLSParserImpl *this_local;
  
  origParent = (DOMNode *)entDecl;
  entDecl_local = (XMLEntityDecl *)this;
  if ((((((this->super_AbstractDOMParser).fCreateEntityReferenceNodes & 1U) != 0) &&
       (this->fFilter != (DOMLSParserFilter *)0x0)) &&
      (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) &&
     (bVar1 = ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::containsKey
                        (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode)
     , bVar1)) {
    ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeKey
              (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
    applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
  }
  local_20 = (this->super_AbstractDOMParser).fCurrentParent;
  AbstractDOMParser::startEntityReference
            (&this->super_AbstractDOMParser,(XMLEntityDecl *)origParent);
  if (((((this->super_AbstractDOMParser).fCreateEntityReferenceNodes & 1U) != 0) &&
      (this->fFilter != (DOMLSParserFilter *)0x0)) &&
     ((this->fFilterAction !=
       (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0
      && ((bVar1 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                   ::containsKey(this->fFilterAction,local_20), bVar1 &&
          (pFVar2 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                    ::get(this->fFilterAction,local_20,XMLPlatformUtils::fgMemoryManager),
          *pFVar2 == FILTER_REJECT)))))) {
    local_24 = FILTER_REJECT;
    ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::put
              (this->fFilterAction,(this->super_AbstractDOMParser).fCurrentNode,&local_24);
  }
  return;
}

Assistant:

void DOMLSParserImpl::startEntityReference(const XMLEntityDecl& entDecl)
{
    if(fCreateEntityReferenceNodes && fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    DOMNode* origParent = fCurrentParent;
    AbstractDOMParser::startEntityReference(entDecl);
    if (fCreateEntityReferenceNodes && fFilter)
    {
        if(fFilterAction && fFilterAction->containsKey(origParent) && fFilterAction->get(origParent)==DOMLSParserFilter::FILTER_REJECT)
            fFilterAction->put(fCurrentNode, DOMLSParserFilter::FILTER_REJECT);
    }
}